

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_keym_v2.cpp
# Opt level: O0

void __thiscall intel_keym_v2_t::key_signature_t::~key_signature_t(key_signature_t *this)

{
  key_signature_t *this_local;
  
  ~key_signature_t(this);
  operator_delete(this);
  return;
}

Assistant:

intel_keym_v2_t::key_signature_t::~key_signature_t() {
    _clean_up();
}